

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O1

void __thiscall
Assimp::X3DImporter::GeometryHelper_Make_Arc2D
          (X3DImporter *this,float pStartAngle,float pEndAngle,float pRadius,size_t pNumSegments,
          list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pVertices)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  undefined8 extraout_RAX;
  X3DImporter *pXVar4;
  size_t pi;
  ulong uVar5;
  uint uVar6;
  float fVar7;
  undefined4 extraout_XMM0_Db;
  float fVar8;
  undefined1 local_78 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  float local_58;
  float fStack_54;
  undefined4 uStack_50;
  float local_48;
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  
  local_48 = pStartAngle;
  if (6.2831855 < ABS(pStartAngle)) {
    local_78._0_8_ = local_78 + 0x10;
    pXVar4 = (X3DImporter *)local_78;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)pXVar4,"GeometryHelper_Make_Arc2D.pStartAngle","");
    Throw_ArgOutOfRange(pXVar4,(string *)local_78);
  }
  else if (ABS(pEndAngle) <= 6.2831855) {
    if (0.0 < pRadius) {
      fVar8 = ABS(pEndAngle - pStartAngle);
      uVar6 = -(uint)(pEndAngle - pStartAngle == 0.0);
      fVar7 = 6.2831855;
      if (fVar8 <= 6.2831855) {
        fVar7 = fVar8;
      }
      fVar7 = (float)(uVar6 & 0x40c90fdb | ~uVar6 & (uint)fVar7);
      local_28 = ZEXT416((uint)fVar7);
      local_38 = ZEXT416((uint)(fVar7 / (float)pNumSegments));
      uVar5 = 0;
      do {
        fVar7 = (float)uVar5 * (float)local_38._0_4_ + local_48;
        local_58 = cosf(fVar7);
        local_58 = local_58 * pRadius;
        fStack_54 = (float)extraout_XMM0_Db;
        fVar7 = sinf(fVar7);
        uStack_50 = fStack_54;
        fStack_54 = fVar7 * pRadius;
        p_Var2 = (_List_node_base *)operator_new(0x20);
        p_Var2[1]._M_next = (_List_node_base *)CONCAT44(fStack_54,local_58);
        *(undefined4 *)&p_Var2[1]._M_prev = 0;
        std::__detail::_List_node_base::_M_hook(p_Var2);
        psVar1 = &(pVertices->
                  super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
                  _M_node._M_size;
        *psVar1 = *psVar1 + 1;
        uVar5 = uVar5 + 1;
      } while (uVar5 <= pNumSegments);
      if (((float)local_28._0_4_ == 6.2831855) && (!NAN((float)local_28._0_4_))) {
        p_Var2 = (pVertices->
                 super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
                 _M_node.super__List_node_base._M_next;
        p_Var3 = (_List_node_base *)operator_new(0x20);
        p_Var3[1]._M_next = p_Var2[1]._M_next;
        *(undefined4 *)&p_Var3[1]._M_prev = *(undefined4 *)&p_Var2[1]._M_prev;
        std::__detail::_List_node_base::_M_hook(p_Var3);
        psVar1 = &(pVertices->
                  super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
                  _M_node._M_size;
        *psVar1 = *psVar1 + 1;
      }
      return;
    }
    goto LAB_005ffb7f;
  }
  local_78._0_8_ = local_78 + 0x10;
  pXVar4 = (X3DImporter *)local_78;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)pXVar4,"GeometryHelper_Make_Arc2D.pEndAngle","");
  Throw_ArgOutOfRange(pXVar4,(string *)local_78);
LAB_005ffb7f:
  pXVar4 = (X3DImporter *)local_78;
  local_78._0_8_ = local_78 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)pXVar4,"GeometryHelper_Make_Arc2D.pRadius","");
  Throw_ArgOutOfRange(pXVar4,(string *)local_78);
  if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
    operator_delete((void *)local_78._0_8_,local_68._M_allocated_capacity + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void X3DImporter::GeometryHelper_Make_Arc2D(const float pStartAngle, const float pEndAngle, const float pRadius, size_t pNumSegments,
												std::list<aiVector3D>& pVertices)
{
	// check argument values ranges.
    if ( ( pStartAngle < -AI_MATH_TWO_PI_F ) || ( pStartAngle > AI_MATH_TWO_PI_F ) )
    {
        Throw_ArgOutOfRange( "GeometryHelper_Make_Arc2D.pStartAngle" );
    }
    if ( ( pEndAngle < -AI_MATH_TWO_PI_F ) || ( pEndAngle > AI_MATH_TWO_PI_F ) )
    {
        Throw_ArgOutOfRange( "GeometryHelper_Make_Arc2D.pEndAngle" );
    }
    if ( pRadius <= 0 )
    {
        Throw_ArgOutOfRange( "GeometryHelper_Make_Arc2D.pRadius" );
    }

	// calculate arc angle and check type of arc
	float angle_full = std::fabs(pEndAngle - pStartAngle);
    if ( ( angle_full > AI_MATH_TWO_PI_F ) || ( angle_full == 0.0f ) )
    {
        angle_full = AI_MATH_TWO_PI_F;
    }

	// calculate angle for one step - angle to next point of line.
	float angle_step = angle_full / (float)pNumSegments;
	// make points
	for(size_t pi = 0; pi <= pNumSegments; pi++)
	{
		float tangle = pStartAngle + pi * angle_step;
		pVertices.push_back(GeometryHelper_Make_Point2D(tangle, pRadius));
	}// for(size_t pi = 0; pi <= pNumSegments; pi++)

	// if we making full circle then add last vertex equal to first vertex
	if(angle_full == AI_MATH_TWO_PI_F) pVertices.push_back(*pVertices.begin());
}